

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall
solitaire::Context::Context
          (Context *this,
          unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
          *solitaire,FoundationPileColliders *foundationPileColliders,
          TableauPileColliders *tableauPileColliders,
          unique_ptr<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
          *stockPileCollider,
          unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
          *newGameButton,
          unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
          *undoButton)

{
  unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
  *newGameButton_local;
  unique_ptr<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
  *stockPileCollider_local;
  TableauPileColliders *tableauPileColliders_local;
  FoundationPileColliders *foundationPileColliders_local;
  unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  *solitaire_local;
  Context *this_local;
  
  solitaire::interfaces::Context::Context(&this->super_Context);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__Context_0050c168;
  std::
  unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  ::unique_ptr(&this->solitaire,solitaire);
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  ::array(&this->foundationPileColliders,foundationPileColliders);
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  ::array(&this->tableauPileColliders,tableauPileColliders);
  std::
  unique_ptr<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
  ::unique_ptr(&this->stockPileCollider,stockPileCollider);
  std::
  unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>::
  unique_ptr(&this->newGameButton,newGameButton);
  std::
  unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>::
  unique_ptr(&this->undoButton,undoButton);
  return;
}

Assistant:

Context::Context(std::unique_ptr<Solitaire> solitaire,
                 FoundationPileColliders foundationPileColliders,
                 TableauPileColliders tableauPileColliders,
                 std::unique_ptr<StockPileCollider> stockPileCollider,
                 std::unique_ptr<Button> newGameButton,
                 std::unique_ptr<Button> undoButton):
    solitaire {std::move(solitaire)},
    foundationPileColliders {std::move(foundationPileColliders)},
    tableauPileColliders {std::move(tableauPileColliders)},
    stockPileCollider {std::move(stockPileCollider)},
    newGameButton {std::move(newGameButton)},
    undoButton {std::move(undoButton)} {
}